

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

Result<int> * SighashFromStr(Result<int> *__return_storage_ptr__,string *sighash)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  string in_stack_fffffffffffffd68;
  bilingual_str local_260;
  undefined1 *local_220;
  undefined8 local_218;
  undefined1 local_210 [8];
  undefined8 uStack_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [8];
  undefined8 uStack_1e8;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0 [8];
  undefined8 uStack_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [8];
  undefined8 uStack_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 local_170 [8];
  undefined8 uStack_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_140;
  undefined1 *local_118;
  undefined8 local_110;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  undefined4 local_f8;
  undefined1 *local_f0;
  undefined8 local_e8;
  undefined1 local_e0 [8];
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined4 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  undefined8 uStack_88;
  undefined4 local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  undefined4 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [8];
  undefined8 uStack_38;
  undefined4 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&SighashFromStr(std::__cxx11::string_const&)::
                                 map_sighash_values_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"DEFAULT",(allocator<char> *)&stack0xfffffffffffffd7f);
      local_140.first._M_dataplus._M_p = (pointer)&local_140.first.field_2;
      if (local_160 == &local_150) {
        local_140.first.field_2._8_8_ = local_150._8_8_;
      }
      else {
        local_140.first._M_dataplus._M_p = (pointer)local_160;
      }
      local_140.first._M_string_length = local_158;
      local_158 = 0;
      local_150._M_local_buf[0] = '\0';
      local_140.second = 0;
      local_160 = &local_150;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"ALL",(allocator<char> *)&stack0xfffffffffffffd7e);
      local_110 = local_178;
      local_118 = local_108;
      if (local_180 == local_170) {
        uStack_100 = uStack_168;
      }
      else {
        local_118 = local_180;
      }
      local_178 = 0;
      local_170[0] = 0;
      local_f8 = 1;
      local_180 = local_170;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"ALL|ANYONECANPAY",(allocator<char> *)&stack0xfffffffffffffd7d
                );
      local_e8 = local_198;
      local_f0 = local_e0;
      if (local_1a0 == local_190) {
        uStack_d8 = uStack_188;
      }
      else {
        local_f0 = local_1a0;
      }
      local_198 = 0;
      local_190[0] = 0;
      local_d0 = 0x81;
      local_1a0 = local_190;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"NONE",(allocator<char> *)&stack0xfffffffffffffd7c);
      local_c0 = local_1b8;
      local_c8 = local_b8;
      if (local_1c0 == local_1b0) {
        uStack_b0 = uStack_1a8;
      }
      else {
        local_c8 = local_1c0;
      }
      local_1b8 = 0;
      local_1b0[0] = 0;
      local_a8 = 2;
      local_1c0 = local_1b0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"NONE|ANYONECANPAY",
                 (allocator<char> *)&stack0xfffffffffffffd7b);
      local_98 = local_1d8;
      local_a0 = local_90;
      if (local_1e0 == local_1d0) {
        uStack_88 = uStack_1c8;
      }
      else {
        local_a0 = local_1e0;
      }
      local_1d8 = 0;
      local_1d0[0] = 0;
      local_80 = 0x82;
      local_1e0 = local_1d0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,"SINGLE",(allocator<char> *)&stack0xfffffffffffffd7a);
      local_70 = local_1f8;
      local_78 = local_68;
      if (local_200 == local_1f0) {
        uStack_60 = uStack_1e8;
      }
      else {
        local_78 = local_200;
      }
      local_1f8 = 0;
      local_1f0[0] = 0;
      local_58 = 3;
      local_200 = local_1f0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"SINGLE|ANYONECANPAY",
                 (allocator<char> *)&stack0xfffffffffffffd79);
      local_48 = local_218;
      local_50 = local_40;
      if (local_220 == local_210) {
        uStack_38 = uStack_208;
      }
      else {
        local_50 = local_220;
      }
      local_218 = 0;
      local_210[0] = 0;
      local_30 = 0x83;
      __l._M_len = 7;
      __l._M_array = &local_140;
      local_220 = local_210;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::map(&SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xfffffffffffffd78,(allocator_type *)&stack0xfffffffffffffd77);
      lVar3 = 0xf0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_140.first._M_dataplus._M_p + lVar3));
        lVar3 = lVar3 + -0x28;
      } while (lVar3 != -0x28);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::~map,&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SighashFromStr(std::__cxx11::string_const&)::
                           map_sighash_values_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_._M_t,
                 sighash);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &SighashFromStr(std::__cxx11::string_const&)::map_sighash_values_abi_cxx11_._M_t._M_impl.
       super__Rb_tree_header) {
    std::operator+(&local_140.first,"\'",sighash);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffd80,&local_140.first,"\' is not a valid sighash parameter.")
    ;
    Untranslated(&local_260,in_stack_fffffffffffffd68);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,int>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,int> *)__return_storage_ptr__,&local_260);
    bilingual_str::~bilingual_str(&local_260);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    *(_Rb_tree_color *)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
      super__Move_assign_alias<bilingual_str,_int>.super__Copy_assign_alias<bilingual_str,_int>.
      super__Move_ctor_alias<bilingual_str,_int>.super__Copy_ctor_alias<bilingual_str,_int>.
      super__Variant_storage_alias<bilingual_str,_int> = cVar2._M_node[2]._M_color;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_int>.
             super__Move_assign_alias<bilingual_str,_int>.
             super__Copy_assign_alias<bilingual_str,_int>.super__Move_ctor_alias<bilingual_str,_int>
             .super__Copy_ctor_alias<bilingual_str,_int>.
             super__Variant_storage_alias<bilingual_str,_int> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<int> SighashFromStr(const std::string& sighash)
{
    static const std::map<std::string, int> map_sighash_values = {
        {std::string("DEFAULT"), int(SIGHASH_DEFAULT)},
        {std::string("ALL"), int(SIGHASH_ALL)},
        {std::string("ALL|ANYONECANPAY"), int(SIGHASH_ALL|SIGHASH_ANYONECANPAY)},
        {std::string("NONE"), int(SIGHASH_NONE)},
        {std::string("NONE|ANYONECANPAY"), int(SIGHASH_NONE|SIGHASH_ANYONECANPAY)},
        {std::string("SINGLE"), int(SIGHASH_SINGLE)},
        {std::string("SINGLE|ANYONECANPAY"), int(SIGHASH_SINGLE|SIGHASH_ANYONECANPAY)},
    };
    const auto& it = map_sighash_values.find(sighash);
    if (it != map_sighash_values.end()) {
        return it->second;
    } else {
        return util::Error{Untranslated("'" + sighash + "' is not a valid sighash parameter.")};
    }
}